

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decimfmt.cpp
# Opt level: O3

void __thiscall icu_63::DecimalFormat::setMultiplier(DecimalFormat *this,int32_t multiplier)

{
  DecimalFormatProperties *pDVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  bool bVar5;
  UErrorCode localStatus;
  undefined8 uStack_8;
  
  iVar4 = multiplier + (uint)(multiplier == 0);
  uVar2 = 0;
  iVar3 = iVar4;
  do {
    if (iVar3 == 1) {
      iVar4 = 1;
      goto LAB_0025dfc9;
    }
    uVar2 = uVar2 + 1;
    bVar5 = (iVar3 / 10) * 10 == iVar3;
    iVar3 = iVar3 / 10;
  } while (bVar5);
  uVar2 = 0;
LAB_0025dfc9:
  pDVar1 = (this->fields->properties).
           super_LocalPointerBase<icu_63::number::impl::DecimalFormatProperties>.ptr;
  pDVar1->magnitudeMultiplier = uVar2;
  pDVar1->multiplier = iVar4;
  uStack_8 = (ulong)uVar2;
  touch(this,(UErrorCode *)((long)&uStack_8 + 4));
  return;
}

Assistant:

void DecimalFormat::setMultiplier(int32_t multiplier) {
    if (multiplier == 0) {
        multiplier = 1;     // one being the benign default value for a multiplier.
    }

    // Try to convert to a magnitude multiplier first
    int delta = 0;
    int value = multiplier;
    while (value != 1) {
        delta++;
        int temp = value / 10;
        if (temp * 10 != value) {
            delta = -1;
            break;
        }
        value = temp;
    }
    if (delta != -1) {
        fields->properties->magnitudeMultiplier = delta;
        fields->properties->multiplier = 1;
    } else {
        fields->properties->magnitudeMultiplier = 0;
        fields->properties->multiplier = multiplier;
    }
    touchNoError();
}